

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_string_ops.hpp
# Opt level: O1

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
gmlc::utilities::
generalized_section_splitting<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
          (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           *__return_storage_ptr__,utilities *this,
          basic_string_view<char,_std::char_traits<char>_> *line,
          basic_string_view<char,_std::char_traits<char>_> *delimiterCharacters,
          basic_string_view<char,_std::char_traits<char>_> *sectionStartCharacters,
          CharMapper<unsigned_char> *sectionMatch,bool compress)

{
  pointer *ppbVar1;
  char *pcVar2;
  basic_string_view<char,_std::char_traits<char>_> *pbVar3;
  size_type sVar4;
  size_type sVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  iterator iVar9;
  undefined1 compress_00;
  ulong uVar10;
  undefined4 uVar11;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> *local_48;
  basic_string_view<char,_std::char_traits<char>_> *local_40;
  basic_string_view<char,_std::char_traits<char>_> *local_38;
  
  compress_00 = SUB81(sectionStartCharacters,0);
  local_40 = delimiterCharacters;
  local_38 = sectionStartCharacters;
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)this,
                     delimiterCharacters->_M_str,0,delimiterCharacters->_M_len);
  if (sVar4 == 0xffffffffffffffff) {
    generalized_string_split<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              (__return_storage_ptr__,this,line,
               (basic_string_view<char,_std::char_traits<char>_> *)((ulong)sectionMatch & 0xff),
               (bool)compress_00);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48 = line;
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      ((basic_string_view<char,_std::char_traits<char>_> *)this,line->_M_str,0,
                       line->_M_len);
    if (sVar5 == 0xffffffffffffffff) {
      iVar9._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)__return_storage_ptr__,iVar9,
                   (basic_string_view<char,_std::char_traits<char>_> *)this);
      }
      else {
        pcVar2 = *(char **)(this + 8);
        (iVar9._M_current)->_M_len = *(size_t *)this;
        (iVar9._M_current)->_M_str = pcVar2;
        ppbVar1 = &(__return_storage_ptr__->
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
    }
    else {
      uVar10 = *(ulong *)this;
      if (uVar10 != 0) {
        uVar8 = 0;
        do {
          if (sVar5 < sVar4) {
            uVar6 = sVar5 - uVar8;
            if (uVar6 == 0) {
              if ((byte)sectionMatch == 0) {
                local_58._M_len._0_4_ = 0;
                local_58._M_len = 0;
                local_58._M_str = (char *)0x0;
                iVar9._M_current =
                     (__return_storage_ptr__->
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                uVar11 = 0;
                uVar6 = local_58._M_len;
                if (iVar9._M_current !=
                    (__return_storage_ptr__->
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_003f573f;
                std::
                vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                          ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                            *)__return_storage_ptr__,iVar9,&local_58);
              }
            }
            else {
              if (uVar10 < uVar8) {
                std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > __size (which is %zu)",
                           "basic_string_view::substr",uVar8);
              }
              if (uVar10 - uVar8 < uVar6) {
                uVar6 = uVar10 - uVar8;
              }
              local_58._M_str = (char *)(uVar8 + *(long *)(this + 8));
              iVar9._M_current =
                   (__return_storage_ptr__->
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (iVar9._M_current ==
                  (__return_storage_ptr__->
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                local_58._M_len = uVar6;
                std::
                vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                          ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                            *)__return_storage_ptr__,iVar9,&local_58);
              }
              else {
                local_58._M_len._0_4_ = (undefined4)uVar6;
                local_58._M_len._4_4_ = (undefined4)(uVar6 >> 0x20);
                uVar11 = local_58._M_len._4_4_;
LAB_003f573f:
                local_58._M_len = uVar6;
                *(undefined4 *)&(iVar9._M_current)->_M_len = (undefined4)local_58._M_len;
                *(undefined4 *)((long)&(iVar9._M_current)->_M_len + 4) = uVar11;
                (iVar9._M_current)->_M_str = local_58._M_str;
                ppbVar1 = &(__return_storage_ptr__->
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppbVar1 = *ppbVar1 + 1;
              }
            }
            uVar10 = sVar5 + 1;
            sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                              ((basic_string_view<char,_std::char_traits<char>_> *)this,
                               local_48->_M_str,uVar10,local_48->_M_len);
          }
          else {
            sVar7 = getChunkEnd<std::basic_string_view<char,std::char_traits<char>>>
                              (sVar4 + 1,(basic_string_view<char,_std::char_traits<char>_> *)this,
                               *(byte *)(*(long *)(this + 8) + sVar4),
                               *(char *)((long)&local_38->_M_len +
                                        (ulong)*(byte *)(*(long *)(this + 8) + sVar4)));
            pbVar3 = local_48;
            if (sVar7 == 0xffffffffffffffff) {
              sVar7 = *(ulong *)this - uVar8;
              if (*(ulong *)this < uVar8) {
                std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > __size (which is %zu)",
                           "basic_string_view::substr",uVar8);
              }
              local_58._M_str = (char *)(uVar8 + *(long *)(this + 8));
              iVar9._M_current =
                   (__return_storage_ptr__->
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              local_58._M_len = sVar7;
              if (iVar9._M_current ==
                  (__return_storage_ptr__->
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                          ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                            *)__return_storage_ptr__,iVar9,&local_58);
              }
              else {
                (iVar9._M_current)->_M_len = sVar7;
                (iVar9._M_current)->_M_str = local_58._M_str;
                ppbVar1 = &(__return_storage_ptr__->
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppbVar1 = *ppbVar1 + 1;
              }
              uVar10 = *(ulong *)this;
            }
            else {
              sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                ((basic_string_view<char,_std::char_traits<char>_> *)this,
                                 local_48->_M_str,sVar7 + 1,local_48->_M_len);
              if (sVar4 == 0xffffffffffffffff) {
                sVar7 = *(ulong *)this - uVar8;
                if (*(ulong *)this < uVar8) {
                  std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > __size (which is %zu)",
                             "basic_string_view::substr",uVar8);
                }
                local_58._M_str = (char *)(uVar8 + *(long *)(this + 8));
                iVar9._M_current =
                     (__return_storage_ptr__->
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                local_58._M_len = sVar7;
                if (iVar9._M_current ==
                    (__return_storage_ptr__->
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                            ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                              *)__return_storage_ptr__,iVar9,&local_58);
                }
                else {
                  (iVar9._M_current)->_M_len = sVar7;
                  (iVar9._M_current)->_M_str = local_58._M_str;
                  ppbVar1 = &(__return_storage_ptr__->
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
                  *ppbVar1 = *ppbVar1 + 1;
                }
                uVar10 = 0xffffffffffffffff;
                sVar4 = 0xffffffffffffffff;
              }
              else {
                uVar10 = *(ulong *)this - uVar8;
                if (*(ulong *)this < uVar8) {
                  std::__throw_out_of_range_fmt
                            ("%s: __pos (which is %zu) > __size (which is %zu)",
                             "basic_string_view::substr",uVar8);
                }
                local_58._M_len = sVar4 - uVar8;
                if (uVar10 < sVar4 - uVar8) {
                  local_58._M_len = uVar10;
                }
                local_58._M_str = (char *)(uVar8 + *(long *)(this + 8));
                iVar9._M_current =
                     (__return_storage_ptr__->
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                if (iVar9._M_current ==
                    (__return_storage_ptr__->
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                            ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                              *)__return_storage_ptr__,iVar9,&local_58);
                }
                else {
                  (iVar9._M_current)->_M_len = local_58._M_len;
                  (iVar9._M_current)->_M_str = local_58._M_str;
                  ppbVar1 = &(__return_storage_ptr__->
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
                  *ppbVar1 = *ppbVar1 + 1;
                }
                uVar10 = sVar4 + 1;
                sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                  ((basic_string_view<char,_std::char_traits<char>_> *)this,
                                   local_40->_M_str,uVar10,local_40->_M_len);
              }
              sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                ((basic_string_view<char,_std::char_traits<char>_> *)this,
                                 pbVar3->_M_str,uVar10,pbVar3->_M_len);
            }
          }
          uVar8 = uVar10;
          if ((uVar10 != 0xffffffffffffffff) && (sVar5 == 0xffffffffffffffff)) {
            uVar6 = *(ulong *)this;
            uVar8 = 0xffffffffffffffff;
            if (((byte)sectionMatch & uVar6 <= uVar10) == 0) {
              sVar7 = uVar6 - uVar10;
              if (uVar6 < uVar10) {
                std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > __size (which is %zu)",
                           "basic_string_view::substr",uVar10);
              }
              local_58._M_str = (char *)(uVar10 + *(long *)(this + 8));
              iVar9._M_current =
                   (__return_storage_ptr__->
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              local_58._M_len = sVar7;
              if (iVar9._M_current ==
                  (__return_storage_ptr__->
                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                          ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                            *)__return_storage_ptr__,iVar9,&local_58);
              }
              else {
                (iVar9._M_current)->_M_len = sVar7;
                (iVar9._M_current)->_M_str = local_58._M_str;
                ppbVar1 = &(__return_storage_ptr__->
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppbVar1 = *ppbVar1 + 1;
              }
            }
          }
          uVar10 = *(ulong *)this;
        } while (uVar8 < uVar10);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<XO> generalized_section_splitting(
    const X& line,
    const X& delimiterCharacters,
    const X& sectionStartCharacters,
    const utilities::CharMapper<unsigned char>& sectionMatch,
    bool compress)
{
    auto sectionLoc = line.find_first_of(sectionStartCharacters);

    if (sectionLoc == X::npos) {
        return generalized_string_split<X, XO>(
            line, delimiterCharacters, compress);
    }
    std::vector<XO> strVec;

    auto d1 = line.find_first_of(delimiterCharacters);
    if (d1 == X::npos)  // there are no delimiters
    {
        strVec.emplace_back(line);
        return strVec;
    }
    decltype(sectionLoc) start = 0;

    while (start < line.length()) {
        if (sectionLoc > d1) {
            if (start == d1) {
                if (!compress) {
                    strVec.push_back(XO{});
                }
            } else {
                strVec.emplace_back(line.substr(start, d1 - start));
            }
            start = d1 + 1;
            d1 = line.find_first_of(delimiterCharacters, start);
        } else {
            // now we are in a quote
            auto endLoc = getChunkEnd(
                sectionLoc + 1,
                line,
                line[sectionLoc],
                sectionMatch[line[sectionLoc]]);
            if (endLoc != X::npos) {
                d1 = line.find_first_of(delimiterCharacters, endLoc + 1);
                if (d1 == X::npos) {
                    strVec.emplace_back(line.substr(start));
                    sectionLoc = d1;
                    start = d1;
                } else {
                    strVec.emplace_back(line.substr(start, d1 - start));
                    sectionLoc =
                        line.find_first_of(sectionStartCharacters, d1 + 1);
                    start = d1 + 1;
                }
                d1 = line.find_first_of(delimiterCharacters, start);
            } else {
                strVec.emplace_back(line.substr(start));
                start = line.length();
            }
        }
        // get the last string
        if (d1 == X::npos) {
            if (start != X::npos) {
                if ((start < line.length()) || (!compress)) {
                    strVec.emplace_back(line.substr(start));
                }
                start = d1;
            }
        }
    }
    return strVec;
}